

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O0

void __thiscall amrex::MultiFab::initVal(MultiFab *this)

{
  bool bVar1;
  MFIter *in_RDI;
  FArrayBox *fab;
  MFIter mfi;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffff90;
  uchar in_stack_ffffffffffffffb7;
  FabArrayBase *in_stack_ffffffffffffffb8;
  MFIter *in_stack_ffffffffffffffc0;
  
  MFIter::MFIter(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb7);
  while( true ) {
    bVar1 = MFIter::isValid((MFIter *)&stack0xffffffffffffff98);
    if (!bVar1) break;
    in_stack_ffffffffffffff90 =
         (FabArray<amrex::FArrayBox> *)
         FabArray<amrex::FArrayBox>::operator[](in_stack_ffffffffffffff90,in_RDI);
    FArrayBox::initVal((FArrayBox *)in_stack_ffffffffffffffb8);
    MFIter::operator++((MFIter *)&stack0xffffffffffffff98);
  }
  MFIter::~MFIter((MFIter *)in_stack_ffffffffffffff90);
  return;
}

Assistant:

void
MultiFab::initVal ()
{
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*this); mfi.isValid(); ++mfi)
    {
        FArrayBox& fab = (*this)[mfi];
        fab.initVal();
    }
}